

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_reader.cxx
# Opt level: O2

size_t __thiscall
xray_re::xr_reader::r_raw_chunk(xr_reader *this,uint32_t id,void *dest,size_t dest_size)

{
  uint __line;
  undefined8 in_RAX;
  size_t dest_size_00;
  char *__assertion;
  bool compressed;
  
  compressed = SUB81((ulong)in_RAX >> 0x38,0);
  dest_size_00 = find_chunk(this,id,&compressed,true);
  if (dest_size_00 == 0) {
    return 0;
  }
  if (compressed == true) {
    __assertion = "!compressed";
    __line = 99;
  }
  else {
    if (dest_size_00 <= dest_size) {
      r_raw(this,dest,dest_size_00);
      return dest_size_00;
    }
    __assertion = "size <= dest_size";
    __line = 100;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_reader.cxx"
                ,__line,"size_t xray_re::xr_reader::r_raw_chunk(uint32_t, void *, size_t)");
}

Assistant:

size_t xr_reader::r_raw_chunk(uint32_t id, void *dest, size_t dest_size)
{
	bool compressed;
	size_t size = find_chunk(id, &compressed);
	if (size == 0)
		return 0;
	assert(!compressed);
	assert(size <= dest_size);
	r_raw(dest, size);
	return size;
}